

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTheory.hpp
# Opt level: O1

void __thiscall subsat::BindingsManager::BindingsManager(BindingsManager *this)

{
  (this->m_bindings).m_data.
  super__Vector_base<subsat::BindingsManager::BindingsRef,_std::allocator<subsat::BindingsManager::BindingsRef>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_bindings).m_data.
  super__Vector_base<subsat::BindingsManager::BindingsRef,_std::allocator<subsat::BindingsManager::BindingsRef>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_bindings_storage).
  super__Vector_base<std::pair<unsigned_int,_Kernel::TermList>,_std::allocator<std::pair<unsigned_int,_Kernel::TermList>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_bindings).m_data.
  super__Vector_base<subsat::BindingsManager::BindingsRef,_std::allocator<subsat::BindingsManager::BindingsRef>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_bindings_storage).
  super__Vector_base<std::pair<unsigned_int,_Kernel::TermList>,_std::allocator<std::pair<unsigned_int,_Kernel::TermList>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_bindings_storage).
  super__Vector_base<std::pair<unsigned_int,_Kernel::TermList>,_std::allocator<std::pair<unsigned_int,_Kernel::TermList>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::
  vector<subsat::BindingsManager::BindingsRef,_std::allocator<subsat::BindingsManager::BindingsRef>_>
  ::reserve(&(this->m_bindings).m_data,0x20);
  std::
  vector<std::pair<unsigned_int,_Kernel::TermList>,_std::allocator<std::pair<unsigned_int,_Kernel::TermList>_>_>
  ::reserve(&this->m_bindings_storage,0x80);
  return;
}

Assistant:

BindingsManager()
  {
    m_bindings.reserve(32);
    m_bindings_storage.reserve(128);
  }